

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O0

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::__updateHashValue
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this)

{
  size_type sVar1;
  reference pvVar2;
  byte *pbVar3;
  ulong local_18;
  size_t k;
  ThreeWiseHash<unsigned_int,_unsigned_char> *this_local;
  
  this->hashvalue = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->ngram);
    if (sVar1 <= local_18) break;
    pvVar2 = std::
             vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
             ::operator[](&this->hashers,local_18);
    pbVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->ngram,local_18);
    this->hashvalue = pvVar2->hashvalues[*pbVar3] ^ this->hashvalue;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void __updateHashValue() {
    hashvalue = 0;
    for (size_t k = 0; k < ngram.size(); ++k) {
      hashvalue ^= hashers[k].hashvalues[ngram[k]];
    }
  }